

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyfiledialogs.c
# Opt level: O3

int osx9orBetter(void)

{
  int iVar1;
  FILE *__stream;
  char *pcVar2;
  int V;
  int v;
  char lBuff [1024];
  uint local_410;
  int local_40c;
  char local_408 [1024];
  
  if (-1 < osx9orBetter::lOsx9orBetter) {
    return osx9orBetter::lOsx9orBetter;
  }
  osx9orBetter::lOsx9orBetter = 0;
  __stream = popen("osascript -e \'set osver to system version of (system info)\'","r");
  pcVar2 = fgets(local_408,0x400,__stream);
  if (pcVar2 != (char *)0x0) {
    iVar1 = __isoc99_sscanf(local_408,"%d.%d",&local_410,&local_40c);
    if ((iVar1 == 2) && (local_410 = local_410 * 100 + local_40c, 0x3f0 < (int)local_410)) {
      osx9orBetter::lOsx9orBetter = 1;
    }
  }
  pclose(__stream);
  if (tinyfd_verbose != 0) {
    printf("Osx10 = %d, %d = %s\n",(ulong)(uint)osx9orBetter::lOsx9orBetter,(ulong)local_410,
           local_408);
  }
  return osx9orBetter::lOsx9orBetter;
}

Assistant:

static int osx9orBetter( )
{
        static int lOsx9orBetter = -1 ;
        char lBuff [MAX_PATH_OR_CMD] ;
        FILE * lIn ;
        int V,v;

        if ( lOsx9orBetter < 0 )
        {
                lOsx9orBetter = 0 ;
                lIn = popen( "osascript -e 'set osver to system version of (system info)'" , "r" ) ;
                if ( ( fgets( lBuff , sizeof( lBuff ) , lIn ) != NULL )
                        && ( 2 == sscanf(lBuff, "%d.%d", &V, &v) ) )
                {
                        V = V * 100 + v;
                        if ( V >= 1009 )
                        {
                                lOsx9orBetter = 1 ;
                        }
                }
                pclose( lIn ) ;
                if (tinyfd_verbose) printf("Osx10 = %d, %d = %s\n", lOsx9orBetter, V, lBuff) ; 
        }
        return lOsx9orBetter ;
}